

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O3

float mixed_random(void)

{
  uint uVar1;
  
  uVar1 = hash_rng_pos;
  LOCK();
  hash_rng_pos = hash_rng_pos + 1;
  UNLOCK();
  uVar1 = uVar1 * 0x68e31da4 + hash_rng_seed;
  uVar1 = (uVar1 >> 8 ^ uVar1) + 0xb5297a4d;
  uVar1 = (uVar1 * 0x100 ^ uVar1) * 0x1b56c4e9;
  return (float)(uVar1 >> 8 ^ uVar1) * 2.3283064e-10;
}

Assistant:

unsigned int mixed_random_int(void){
  const unsigned int BIT_NOISE1 = 0x68E31DA4;
  const unsigned int BIT_NOISE2 = 0xB5297A4D;
  const unsigned int BIT_NOISE3 = 0x1B56C4E9;
  unsigned int mangled;

 retry:
  mangled = hash_rng_pos;
  if(!atomic_cas(hash_rng_pos, mangled, mangled+1))
    goto retry;
  
  mangled *= BIT_NOISE1;
  mangled += hash_rng_seed;
  mangled ^= (mangled >> 8);
  mangled += BIT_NOISE2;
  mangled ^= (mangled << 8);
  mangled *= BIT_NOISE3;
  mangled ^= (mangled >> 8);
  return mangled;
}